

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_choice.cpp
# Opt level: O0

void Am_Choice_Stop_Method_proc
               (Am_Object *inter,Am_Object *object,Am_Object *event_window,Am_Input_Event *ev)

{
  int iVar1;
  int iVar2;
  Am_Value *pAVar3;
  Am_Inter_Location local_a8;
  Am_Object local_a0;
  Am_Input_Char local_94;
  Am_Object local_90;
  Am_Object local_88;
  Am_Object local_80;
  Am_Input_Char local_74;
  Am_Object local_70;
  Am_Object local_68;
  Am_Object local_60;
  Am_Object local_58 [3];
  Am_Object local_40;
  Am_Object command_obj;
  Am_Inter_Internal_Method inter_method;
  Am_Input_Event *ev_local;
  Am_Object *event_window_local;
  Am_Object *object_local;
  Am_Object *inter_local;
  
  Am_Inter_Internal_Method::Am_Inter_Internal_Method((Am_Inter_Internal_Method *)&command_obj);
  pAVar3 = Am_Object::Get(&Am_Interactor,0xc2,0);
  Am_Inter_Internal_Method::operator=((Am_Inter_Internal_Method *)&command_obj,pAVar3);
  (*(code *)inter_method.from_wrapper)(inter,object,event_window,ev);
  Am_Object::Am_Object(&local_40);
  pAVar3 = Am_Object::Get(inter,0xc5,0);
  Am_Object::operator=(&local_40,pAVar3);
  Am_Object::Am_Object(local_58,&local_40);
  Am_Object::Am_Object(&local_60,object);
  Am_Object::Am_Object(&local_68,inter);
  iVar1 = ev->x;
  iVar2 = ev->y;
  Am_Object::Am_Object(&local_70,event_window);
  local_74 = ev->input_char;
  Choice_Handle_New_Old(local_58,&local_60,&local_68,iVar1,iVar2,&local_70,local_74);
  Am_Object::~Am_Object(&local_70);
  Am_Object::~Am_Object(&local_68);
  Am_Object::~Am_Object(&local_60);
  Am_Object::~Am_Object(local_58);
  Am_Object::Am_Object(&local_80,inter);
  Am_Object::Am_Object(&local_88,&local_40);
  iVar1 = ev->x;
  iVar2 = ev->y;
  Am_Object::Am_Object(&local_90,event_window);
  local_94 = ev->input_char;
  Am_Object::Am_Object(&local_a0,object);
  Am_Inter_Location::Am_Inter_Location(&local_a8,&Am_No_Location);
  Am_Call_Final_Do_And_Register
            (&local_80,&local_88,iVar1,iVar2,&local_90,local_94,&local_a0,&local_a8,
             choice_set_impl_command);
  Am_Inter_Location::~Am_Inter_Location(&local_a8);
  Am_Object::~Am_Object(&local_a0);
  Am_Object::~Am_Object(&local_90);
  Am_Object::~Am_Object(&local_88);
  Am_Object::~Am_Object(&local_80);
  Am_Object::~Am_Object(&local_40);
  return;
}

Assistant:

Am_Define_Method(Am_Inter_Internal_Method, void, Am_Choice_Stop_Method,
                 (Am_Object & inter, Am_Object &object, Am_Object &event_window,
                  Am_Input_Event *ev))
{
  Am_INTER_TRACE_PRINT(inter, "Choice stopping over " << object);

  // First, call the prototype's method.  This is first so the
  // interactor is sure not to be running if the command's do
  // method calls pop-up or something and thus doesn't exit right away.
  Am_Inter_Internal_Method inter_method;
  inter_method = Am_Interactor.Get(Am_INTER_STOP_METHOD);
  inter_method.Call(inter, object, event_window, ev);

  Am_Object command_obj;
  command_obj = inter.Get(Am_COMMAND);
  Choice_Handle_New_Old(command_obj, object, inter, ev->x, ev->y, event_window,
                        ev->input_char);
  Am_Call_Final_Do_And_Register(inter, command_obj, ev->x, ev->y, event_window,
                                ev->input_char, object, Am_No_Location,
                                choice_set_impl_command);
}